

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strutil.cpp
# Opt level: O2

int test_strutil_compmatch(ITesting *t)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  pointer __str;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_db;
  allocator_type local_da;
  allocator<char> local_d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cases;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p;
  string tc;
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&tc,"!func",(allocator<char> *)&p);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"flurp",(allocator<char> *)&cases);
  __l._M_len = 2;
  __l._M_array = &tc;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&patterns,__l,&local_db);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string(local_68 + lVar3 + -0x20);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tc,"func",(allocator<char> *)&p);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"flurp",(allocator<char> *)&local_db);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"apa",&local_d9);
  __l_00._M_len = 3;
  __l_00._M_array = &tc;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&cases,__l_00,&local_da);
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string(local_68 + lVar3 + -0x20);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tc,"flurp",(allocator<char> *)&p);
  uVar2 = 1;
  for (__str = patterns.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __str != patterns.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __str = __str + 1) {
    std::__cxx11::string::string((string *)&p,__str);
    bVar1 = trun::match(&tc,&p);
    uVar2 = uVar2 & bVar1;
    std::__cxx11::string::~string((string *)&p);
  }
  printf("flag: %d\n",(ulong)uVar2);
  std::__cxx11::string::~string((string *)&tc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cases);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&patterns);
  return 0;
}

Assistant:

DLL_EXPORT int test_strutil_compmatch(ITesting *t) {
    std::vector<std::string> patterns = {"!func", "flurp"};
    std::vector<std::string> cases = {"func", "flurp", "apa"};
    std::string tc = "flurp";

    int flag = 1;
    for(auto p : patterns) {
        auto isMatch = trun::match(tc, p);
        flag &= isMatch?1:0;
    }
    printf("flag: %d\n", flag);
    return kTR_Pass;
}